

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * helics::stateString_abi_cxx11_(OperatingState state)

{
  int iVar1;
  char in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_1e;
  allocator<char> local_1d [13];
  undefined7 in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  string *psVar2;
  
  if ((stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::
                                   connected_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,in_stack_fffffffffffffff8,
               (allocator<char> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_
                                 ), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,in_stack_fffffffffffffff8,
               (allocator<char> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0));
    std::allocator<char>::~allocator(local_1d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,in_stack_fffffffffffffff8,
               (allocator<char> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0));
    std::allocator<char>::~allocator(&local_1e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_);
  }
  if (in_DIL == '\0') {
    psVar2 = &stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_;
  }
  else if ((in_DIL == '\x05') || (in_DIL != '\n')) {
    psVar2 = &stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_;
  }
  else {
    psVar2 = &stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& stateString(OperatingState state)
{
    static const std::string connected{"connected"};
    static const std::string estate{"error"};
    static const std::string dis{"disconnected"};
    switch (state) {
        case OperatingState::OPERATING:
            return connected;
        case OperatingState::DISCONNECTED:
            return dis;
        case OperatingState::ERROR_STATE:
        default:
            return estate;
    }
}